

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O1

date_time * __thiscall
booster::locale::date_time::operator>>=(date_time *this,date_time_period_set *v)

{
  abstract_calendar *paVar1;
  size_t sVar2;
  date_time_period *pdVar3;
  size_t sVar4;
  uint uVar5;
  
  sVar2 = date_time_period_set::size(v);
  if (sVar2 != 0) {
    uVar5 = 1;
    sVar2 = 0;
    do {
      pdVar3 = date_time_period_set::operator[](v,sVar2);
      paVar1 = (this->impl_).ptr_;
      (*paVar1->_vptr_abstract_calendar[8])
                (paVar1,(ulong)*(uint *)pdVar3,1,(ulong)(uint)-*(int *)(pdVar3 + 4));
      sVar2 = (size_t)uVar5;
      sVar4 = date_time_period_set::size(v);
      uVar5 = uVar5 + 1;
    } while (sVar2 < sVar4);
  }
  return this;
}

Assistant:

date_time const &date_time::operator>>=(date_time_period_set const &v) 
{
    for(unsigned i=0;i<v.size();i++) {
        *this>>=v[i];
    }
    return *this;
}